

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

int __thiscall
CNet::GetWireInDirection
          (CNet *this,vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,int iPos,int iDirection,
          int iMode,int iValue)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference ppCVar4;
  size_type sVar5;
  CWire *pCStack_60;
  int iWireDirection_1;
  CWire *pWire_1;
  iterator end_1;
  iterator itr_1;
  CWire *pCStack_40;
  int iWireDirection;
  CWire *pWire;
  iterator end;
  iterator itr;
  int iValue_local;
  int iMode_local;
  int iDirection_local;
  int iPos_local;
  vector<CWire_*,_std::allocator<CWire_*>_> *pWireList_local;
  CNet *this_local;
  
  if (iMode == 0) {
    end = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
    pWire = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                    *)&pWire), bVar1) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end);
      pCStack_40 = *ppCVar4;
      uVar2 = CObject::GetProp(&pCStack_40->super_CObject);
      if ((uVar2 & iValue) != 0) {
        uVar2 = CWire::GetDirection(pCStack_40);
        if ((uVar2 & 0xf) == 0) {
          __assert_fail("iWireDirection&(DIR_VERTICAL|DIR_HORIZONTAL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                        ,0x56d,"int CNet::GetWireInDirection(vector<CWire *> *, int, int, int, int)"
                       );
        }
        if (uVar2 == iDirection) {
          if (iDirection == 5) {
            iVar3 = CPoint::Y(pCStack_40->m_pPointE);
            if (iVar3 == iPos) {
              std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                        (pWireList,&stack0xffffffffffffffc0);
            }
          }
          else {
            if (iDirection != 10) {
              __assert_fail("FALSE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                            ,0x579,
                            "int CNet::GetWireInDirection(vector<CWire *> *, int, int, int, int)");
            }
            iVar3 = CPoint::X(pCStack_40->m_pPointE);
            if (iVar3 == iPos) {
              std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                        (pWireList,&stack0xffffffffffffffc0);
            }
          }
        }
      }
      __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
      operator++(&end);
    }
  }
  else if (iMode == 1) {
    end_1 = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
    pWire_1 = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end_1,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                      *)&pWire_1), bVar1) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end_1);
      pCStack_60 = *ppCVar4;
      uVar2 = CObject::GetState(&pCStack_60->super_CObject);
      if ((uVar2 & iValue) != 0) {
        uVar2 = CWire::GetDirection(pCStack_60);
        if ((uVar2 & 0xf) == 0) {
          __assert_fail("iWireDirection&(DIR_VERTICAL|DIR_HORIZONTAL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                        ,0x588,"int CNet::GetWireInDirection(vector<CWire *> *, int, int, int, int)"
                       );
        }
        if (uVar2 == iDirection) {
          if (iDirection == 5) {
            iVar3 = CPoint::Y(pCStack_60->m_pPointE);
            if (iVar3 == iPos) {
              std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                        (pWireList,&stack0xffffffffffffffa0);
            }
          }
          else {
            if (iDirection != 10) {
              __assert_fail("FALSE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                            ,0x594,
                            "int CNet::GetWireInDirection(vector<CWire *> *, int, int, int, int)");
            }
            iVar3 = CPoint::X(pCStack_60->m_pPointE);
            if (iVar3 == iPos) {
              std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back
                        (pWireList,&stack0xffffffffffffffa0);
            }
          }
        }
      }
      __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
      operator++(&end_1);
    }
  }
  sVar5 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size(pWireList);
  return (int)sVar5;
}

Assistant:

int CNet::GetWireInDirection(vector<CWire*>* pWireList, int iPos, int iDirection, int iMode, int iValue)
{

	switch(iMode) {
	case GET_MODE_PROP:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetProp()&iValue)
			{
				int	iWireDirection	=	pWire->GetDirection();

				assert(iWireDirection&(DIR_VERTICAL|DIR_HORIZONTAL));

				if(iWireDirection==iDirection)
				{
					switch(iDirection){
					case DIR_HORIZONTAL:
						if(pWire->m_pPointE->Y()==iPos)	pWireList->push_back(pWire);
						break;
					case DIR_VERTICAL:
						if(pWire->m_pPointE->X()==iPos)	pWireList->push_back(pWire);
						break;
					default:
						assert(FALSE);
						break;
					}
				}
			}
		}
		break;
	case GET_MODE_STATE:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetState()&iValue)
			{
				int	iWireDirection	=	pWire->GetDirection();

				assert(iWireDirection&(DIR_VERTICAL|DIR_HORIZONTAL));

				if(iWireDirection==iDirection)
				{
					switch(iDirection){
					case DIR_HORIZONTAL:
						if(pWire->m_pPointE->Y()==iPos)	pWireList->push_back(pWire);
						break;
					case DIR_VERTICAL:
						if(pWire->m_pPointE->X()==iPos)	pWireList->push_back(pWire);
						break;
					default:
						assert(FALSE);
						break;
					}
				}
			}
		}
		break;
	}

	return	pWireList->size();
}